

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

uint8_t __thiscall MSX::AYPortHandler::get_port_input(AYPortHandler *this,bool port_b)

{
  bool bVar1;
  byte bVar2;
  undefined3 in_register_00000031;
  
  bVar2 = 0xff;
  if (CONCAT31(in_register_00000031,port_b) == 0) {
    bVar2 = *(byte *)((long)(this->joysticks_).
                            super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[this->selected_joystick_]._M_t
                            .
                            super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>
                            ._M_t + 0x40);
    bVar1 = Storage::Tape::BinaryTapePlayer::get_input(this->tape_player_);
    bVar2 = !bVar1 << 7 | bVar2 & 0x3f | 0x40;
  }
  return bVar2;
}

Assistant:

uint8_t get_port_input(bool port_b) {
			if(!port_b) {
				// Bits 0-5: Joystick (up, down, left, right, A, B)
				// Bit 6: keyboard switch (not universal)
				// Bit 7: tape input
				return
					(static_cast<Joystick *>(joysticks_[selected_joystick_].get())->get_state() & 0x3f) |
					0x40 |
					(tape_player_.get_input() ? 0x00 : 0x80);
			}
			return 0xff;
		}